

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_test.cc
# Opt level: O1

void __thiscall leveldb::BloomTest::Build(BloomTest *this)

{
  pointer pbVar1;
  long lVar2;
  ulong uVar3;
  vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> key_slices;
  vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> local_58;
  Slice local_38;
  
  local_58.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
  super__Vector_impl_data._M_finish = (Slice *)0x0;
  local_58.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Slice *)0x0;
  pbVar1 = (this->keys_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->keys_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar1) {
    lVar2 = 8;
    uVar3 = 0;
    do {
      local_38.data_ = *(char **)((long)pbVar1 + lVar2 + -8);
      local_38.size_ = *(size_t *)((long)&(pbVar1->_M_dataplus)._M_p + lVar2);
      if (local_58.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::
        _M_realloc_insert<leveldb::Slice>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        (local_58.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
         super__Vector_impl_data._M_finish)->data_ = local_38.data_;
        (local_58.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
         super__Vector_impl_data._M_finish)->size_ = local_38.size_;
        local_58.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar3 = uVar3 + 1;
      pbVar1 = (this->keys_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 < (ulong)((long)(this->keys_).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5));
  }
  (this->filter_)._M_string_length = 0;
  *(this->filter_)._M_dataplus._M_p = '\0';
  (*this->policy_->_vptr_FilterPolicy[3])
            (this->policy_,
             local_58.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
             super__Vector_impl_data._M_start,
             (ulong)((long)local_58.
                           super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_58.
                          super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 4,&this->filter_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->keys_);
  if (local_58.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Build() {
    std::vector<Slice> key_slices;
    for (size_t i = 0; i < keys_.size(); i++) {
      key_slices.push_back(Slice(keys_[i]));
    }
    filter_.clear();
    policy_->CreateFilter(&key_slices[0], static_cast<int>(key_slices.size()),
                          &filter_);
    keys_.clear();
    if (kVerbose >= 2) DumpFilter();
  }